

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

format_decimal_result<wchar_t_*> __thiscall
fmt::v8::detail::format_decimal<wchar_t,unsigned__int128>
          (detail *this,wchar_t *out,unsigned___int128 value,int size)

{
  undefined2 uVar1;
  ulong uVar2;
  int iVar3;
  undefined8 in_RAX;
  int in_ECX;
  undefined4 in_register_00000014;
  ulong uVar4;
  undefined8 unaff_RBX;
  detail *pdVar5;
  wchar_t *pwVar6;
  detail *pdVar7;
  ulong uVar8;
  bool bVar9;
  bool bVar10;
  undefined1 uVar11;
  undefined1 auVar12 [16];
  format_decimal_result<wchar_t_*> fVar13;
  detail *pdVar14;
  
  uVar4 = CONCAT44(in_register_00000014,size);
  auVar12._8_8_ = unaff_RBX;
  auVar12._0_8_ = in_RAX;
  iVar3 = count_digits_fallback<unsigned__int128>((detail *)out,(unsigned___int128)auVar12);
  if (in_ECX < iVar3) {
    fmt::v8::detail::assert_fail
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/external/fmt/include/fmt/format.h"
               ,0x45e,"invalid digit count");
  }
  pdVar5 = this + (long)in_ECX * 4;
  pwVar6 = out;
  pdVar7 = pdVar5;
  uVar8 = uVar4;
  pdVar14 = pdVar5;
  if ((out < (wchar_t *)0x64) <= uVar4) {
    do {
      pdVar5 = pdVar7 + -8;
      auVar12 = __udivti3(pwVar6,uVar8,100,0);
      uVar4 = auVar12._8_8_;
      out = auVar12._0_8_;
      uVar1 = *(undefined2 *)
               (
               "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
               + (long)(pwVar6 + (long)out * -0x19) * 2);
      uVar11 = (undefined1)((ushort)uVar1 >> 8);
      auVar12 = ZEXT416(CONCAT22((short)(CONCAT13(uVar11,CONCAT12(uVar11,uVar1)) >> 0x10),
                                 CONCAT11((char)uVar1,(char)uVar1)));
      auVar12 = pshuflw(auVar12,auVar12,0x60);
      bVar9 = (wchar_t *)0x270f < pwVar6;
      bVar10 = uVar8 != 0;
      uVar2 = -uVar8;
      *(ulong *)(pdVar7 + -8) = CONCAT44(auVar12._4_4_ >> 0x18,auVar12._0_4_ >> 0x18);
      pwVar6 = out;
      pdVar7 = pdVar5;
      uVar8 = uVar4;
    } while (bVar10 || uVar2 < bVar9);
  }
  if (uVar4 == 0 && (ulong)((wchar_t *)0x9 < out) <= -uVar4) {
    *(uint *)(pdVar5 + -4) = (uint)out | 0x30;
    pdVar5 = pdVar5 + -4;
  }
  else {
    uVar1 = *(undefined2 *)
             (
             "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
             + (long)out * 2);
    uVar11 = (undefined1)((ushort)uVar1 >> 8);
    auVar12 = ZEXT416(CONCAT22((short)(CONCAT13(uVar11,CONCAT12(uVar11,uVar1)) >> 0x10),
                               CONCAT11((char)uVar1,(char)uVar1)));
    auVar12 = pshuflw(auVar12,auVar12,0x60);
    *(ulong *)(pdVar5 + -8) = CONCAT44(auVar12._4_4_ >> 0x18,auVar12._0_4_ >> 0x18);
    pdVar5 = pdVar5 + -8;
  }
  fVar13.end = (wchar_t *)pdVar14;
  fVar13.begin = (wchar_t *)pdVar5;
  return fVar13;
}

Assistant:

FMT_CONSTEXPR20 auto format_decimal(Char* out, UInt value, int size)
    -> format_decimal_result<Char*> {
  FMT_ASSERT(size >= count_digits(value), "invalid digit count");
  out += size;
  Char* end = out;
  while (value >= 100) {
    // Integer division is slow so do it for a group of two digits instead
    // of for every digit. The idea comes from the talk by Alexandrescu
    // "Three Optimization Tips for C++". See speed-test for a comparison.
    out -= 2;
    copy2(out, digits2(static_cast<size_t>(value % 100)));
    value /= 100;
  }
  if (value < 10) {
    *--out = static_cast<Char>('0' + value);
    return {out, end};
  }
  out -= 2;
  copy2(out, digits2(static_cast<size_t>(value)));
  return {out, end};
}